

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O2

void __thiscall
HullLibrary::BringOutYourDead
          (HullLibrary *this,btVector3 *verts,uint vcount,btVector3 *overts,uint *ocount,
          uint *indices,uint indexcount)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  TUIntArray usedIndices;
  btAlignedObjectArray<int> tmpIndices;
  uint local_74;
  btAlignedObjectArray<unsigned_int> local_70;
  btAlignedObjectArray<int> local_50;
  
  local_50.m_ownsMemory = true;
  local_50.m_data = (int *)0x0;
  local_50.m_size = 0;
  local_50.m_capacity = 0;
  local_70._0_4_ = 0;
  btAlignedObjectArray<int>::resize(&local_50,(this->m_vertexIndexMapping).m_size,(int *)&local_70);
  piVar3 = (this->m_vertexIndexMapping).m_data;
  for (lVar4 = 0; lVar4 < (this->m_vertexIndexMapping).m_size; lVar4 = lVar4 + 1) {
    local_50.m_data[lVar4] = piVar3[lVar4];
  }
  local_70.m_ownsMemory = true;
  local_70.m_data = (uint *)0x0;
  local_70.m_size = 0;
  local_70.m_capacity = 0;
  local_74 = 0;
  btAlignedObjectArray<unsigned_int>::resize(&local_70,vcount,&local_74);
  uVar6 = 0;
  memset(local_70.m_data,0,(ulong)vcount << 2);
  *ocount = 0;
  uVar5 = (ulong)indexcount;
  if ((int)indexcount < 1) {
    uVar5 = uVar6;
  }
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    uVar1 = indices[uVar6];
    if (local_70.m_data[(int)uVar1] == 0) {
      uVar2 = *ocount;
      indices[uVar6] = uVar2;
      overts[uVar2].m_floats[0] = verts[uVar1].m_floats[0];
      overts[uVar2].m_floats[1] = verts[uVar1].m_floats[1];
      overts[uVar2].m_floats[2] = verts[uVar1].m_floats[2];
      piVar3 = (this->m_vertexIndexMapping).m_data;
      for (lVar4 = 0; lVar4 < (this->m_vertexIndexMapping).m_size; lVar4 = lVar4 + 1) {
        if (local_50.m_data[lVar4] == uVar1) {
          piVar3[lVar4] = uVar2;
        }
      }
      *ocount = uVar2 + 1;
      local_70.m_data[(int)uVar1] = uVar2 + 1;
    }
    else {
      indices[uVar6] = local_70.m_data[(int)uVar1] - 1;
    }
  }
  btAlignedObjectArray<unsigned_int>::~btAlignedObjectArray(&local_70);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_50);
  return;
}

Assistant:

void HullLibrary::BringOutYourDead(const btVector3* verts,unsigned int vcount, btVector3* overts,unsigned int &ocount,unsigned int *indices,unsigned indexcount)
{
	btAlignedObjectArray<int>tmpIndices;
	tmpIndices.resize(m_vertexIndexMapping.size());
	int i;

	for (i=0;i<m_vertexIndexMapping.size();i++)
	{
		tmpIndices[i] = m_vertexIndexMapping[i];
	}

	TUIntArray usedIndices;
	usedIndices.resize(static_cast<int>(vcount));
	memset(&usedIndices[0],0,sizeof(unsigned int)*vcount);

	ocount = 0;

	for (i=0; i<int (indexcount); i++)
	{
		unsigned int v = indices[i]; // original array index

		btAssert( v >= 0 && v < vcount );

		if ( usedIndices[static_cast<int>(v)] ) // if already remapped
		{
			indices[i] = usedIndices[static_cast<int>(v)]-1; // index to new array
		}
		else
		{

			indices[i] = ocount;      // new index mapping

			overts[ocount][0] = verts[v][0]; // copy old vert to new vert array
			overts[ocount][1] = verts[v][1];
			overts[ocount][2] = verts[v][2];

			for (int k=0;k<m_vertexIndexMapping.size();k++)
			{
				if (tmpIndices[k]==int(v))
					m_vertexIndexMapping[k]=ocount;
			}

			ocount++; // increment output vert count

			btAssert( ocount >=0 && ocount <= vcount );

			usedIndices[static_cast<int>(v)] = ocount; // assign new index remapping

		
		}
	}

	
}